

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-use.c
# Opt level: O1

_Bool borg_aim_wand(wchar_t sval)

{
  wchar_t wVar1;
  char *what;
  
  wVar1 = borg_slot(L'\x17',sval);
  if (L'\xffffffff' < wVar1) {
    if (borg_items[(uint)wVar1].pval != 0) {
      what = format("# Aiming %s.",borg_items + (uint)wVar1);
      borg_note(what);
      borg_keypress(0x61);
      borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[(uint)wVar1]);
      return true;
    }
  }
  return false;
}

Assistant:

bool borg_aim_wand(int sval)
{
    int i;

    /* Look for that wand */
    i = borg_slot(TV_WAND, sval);

    /* None available */
    if (i < 0)
        return false;

    /* No charges */
    if (!borg_items[i].pval)
        return false;

    /* Log the message */
    borg_note(format("# Aiming %s.", borg_items[i].desc));

    /* Perform the action */
    borg_keypress('a');
    borg_keypress(all_letters_nohjkl[i]);

    /* Success */
    return true;
}